

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseLookupSuffix(Ver_Man_t *pMan,char *pWord,int *pnMsb,int *pnLsb)

{
  int iVar1;
  uint local_34;
  uint *puStack_30;
  uint Value;
  int *pnLsb_local;
  int *pnMsb_local;
  char *pWord_local;
  Ver_Man_t *pMan_local;
  
  *pnLsb = -1;
  *pnMsb = -1;
  if ((pMan->tName2Suffix != (st__table *)0x0) &&
     (puStack_30 = (uint *)pnLsb, pnLsb_local = pnMsb, pnMsb_local = (int *)pWord,
     pWord_local = (char *)pMan, iVar1 = st__lookup(pMan->tName2Suffix,pWord,(char **)&local_34),
     iVar1 != 0)) {
    *pnLsb_local = local_34 >> 8 & 0xff;
    *puStack_30 = local_34 & 0xff;
  }
  return 1;
}

Assistant:

int Ver_ParseLookupSuffix( Ver_Man_t * pMan, char * pWord, int * pnMsb, int * pnLsb )
{
    unsigned Value;
    *pnMsb = *pnLsb = -1;
    if ( pMan->tName2Suffix == NULL )
        return 1;
    if ( ! st__lookup( pMan->tName2Suffix, (char *)pWord, (char **)&Value ) )
        return 1;
    *pnMsb = (Value >> 8) & 0xff;
    *pnLsb = Value & 0xff;
    return 1;
}